

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS ref_metric_limit_h(REF_DBL *metric,REF_GRID ref_grid,REF_DBL hmin,REF_DBL hmax)

{
  uint uVar1;
  REF_NODE pRVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  REF_DBL diag_system [12];
  double local_98;
  double local_90;
  double local_88;
  
  pRVar2 = ref_grid->node;
  if (0 < pRVar2->max) {
    dVar5 = 1.0 / (hmin * hmin);
    dVar4 = 1.0 / (hmax * hmax);
    lVar3 = 0;
    do {
      if (-1 < pRVar2->global[lVar3]) {
        uVar1 = ref_matrix_diag_m(metric,&local_98);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x83e,"ref_metric_limit_h",(ulong)uVar1,"eigen decomp");
          return uVar1;
        }
        if (0.0 < hmin) {
          if (dVar5 <= local_98) {
            local_98 = dVar5;
          }
          if (dVar5 <= local_90) {
            local_90 = dVar5;
          }
          if (dVar5 <= local_88) {
            local_88 = dVar5;
          }
        }
        if (0.0 < hmax) {
          if (local_98 <= dVar4) {
            local_98 = dVar4;
          }
          if (local_90 <= dVar4) {
            local_90 = dVar4;
          }
          if (local_88 <= dVar4) {
            local_88 = dVar4;
          }
        }
        uVar1 = ref_matrix_form_m(&local_98,metric);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x84b,"ref_metric_limit_h",(ulong)uVar1,"reform m");
          return uVar1;
        }
      }
      lVar3 = lVar3 + 1;
      pRVar2 = ref_grid->node;
      metric = metric + 6;
    } while (lVar3 < pRVar2->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_limit_h(REF_DBL *metric, REF_GRID ref_grid,
                                      REF_DBL hmin, REF_DBL hmax) {
  REF_DBL diag_system[12];
  REF_DBL eig;
  REF_INT node;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    RSS(ref_matrix_diag_m(&(metric[6 * node]), diag_system), "eigen decomp");
    if (hmin > 0.0) {
      eig = 1.0 / (hmin * hmin);
      ref_matrix_eig(diag_system, 0) = MIN(ref_matrix_eig(diag_system, 0), eig);
      ref_matrix_eig(diag_system, 1) = MIN(ref_matrix_eig(diag_system, 1), eig);
      ref_matrix_eig(diag_system, 2) = MIN(ref_matrix_eig(diag_system, 2), eig);
    }
    if (hmax > 0.0) {
      eig = 1.0 / (hmax * hmax);
      ref_matrix_eig(diag_system, 0) = MAX(ref_matrix_eig(diag_system, 0), eig);
      ref_matrix_eig(diag_system, 1) = MAX(ref_matrix_eig(diag_system, 1), eig);
      ref_matrix_eig(diag_system, 2) = MAX(ref_matrix_eig(diag_system, 2), eig);
    }
    RSS(ref_matrix_form_m(diag_system, &(metric[6 * node])), "reform m");
  }
  return REF_SUCCESS;
}